

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

unique_ptr<Catch::TeamCityReporter> __thiscall
Catch::Detail::make_unique<Catch::TeamCityReporter,Catch::ReporterConfig_const&>
          (Detail *this,ReporterConfig *args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0xc0);
  *(undefined2 *)(puVar1 + 1) = 0;
  *puVar1 = &PTR__TeamCityReporter_001bab30;
  puVar1[2] = args->m_fullConfig;
  puVar1[3] = args->m_stream;
  puVar1[4] = 0;
  *(undefined1 *)(puVar1 + 9) = 0;
  puVar1[10] = 0;
  *(undefined1 *)(puVar1 + 0x11) = 0;
  puVar1[0x14] = 0;
  puVar1[0x15] = 0;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0;
  *puVar1 = &PTR__TeamCityReporter_001bb3e0;
  *(undefined1 *)(puVar1 + 0x16) = 0;
  puVar1[0x17] = 0;
  *(undefined1 *)(puVar1 + 1) = 1;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<Catch::TeamCityReporter>)(TeamCityReporter *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        // static_cast<Args&&> does the same thing as std::forward in
        // this case, but does not require including big header (<utility>)
        // and compiles faster thanks to not requiring template instantiation
        // and overload resolution
        return unique_ptr<T>(new T(static_cast<Args&&>(args)...));
    }